

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_aggregate_expression.cpp
# Opt level: O1

BindResult * __thiscall
duckdb::BaseSelectBinder::BindAggregate
          (BindResult *__return_storage_ptr__,BaseSelectBinder *this,FunctionExpression *aggr,
          AggregateFunctionCatalogEntry *func,idx_t depth)

{
  string *psVar1;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_00
  ;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *expr;
  char cVar2;
  undefined1 uVar3;
  ClientContext *pCVar4;
  pointer pVVar5;
  pointer pOVar6;
  Binder *pBVar7;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var8;
  pointer pBVar9;
  BoundSelectNode *pBVar10;
  pointer puVar11;
  pointer puVar12;
  size_type sVar13;
  pointer pcVar14;
  BoundResultModifier *pBVar15;
  optional_ptr<duckdb::Binder,_true> oVar16;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var17;
  FunctionExpression *pFVar18;
  bool bVar19;
  OrderType order_type;
  OrderByNullType OVar20;
  int iVar21;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar22;
  pointer pOVar23;
  reference pvVar24;
  reference pvVar25;
  type pPVar26;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar27;
  pointer pEVar28;
  type pEVar29;
  vector<duckdb::Value,_true> *pvVar30;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var31;
  pointer pPVar32;
  BaseExpression *this_01;
  ConstantExpression *pCVar33;
  ClientConfig *pCVar34;
  idx_t offset;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> _Var35;
  DBConfig *pDVar36;
  CollationBinding *this_02;
  pointer pBVar37;
  pointer pBVar38;
  iterator iVar39;
  mapped_type *pmVar40;
  reference pvVar41;
  BinderException *pBVar42;
  long lVar43;
  AggregateFunctionSet *this_03;
  size_type __n;
  byte bVar44;
  pointer pOVar45;
  undefined8 *puVar46;
  undefined8 *puVar47;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var48;
  pointer pOVar49;
  OrderByNode *order;
  size_type sVar50;
  BoundOrderByNode *order_by;
  pointer v;
  pointer pBVar51;
  byte bVar52;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
  aggregate;
  unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
  order_bys;
  Value value;
  templated_unique_single_t colref;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  children;
  vector<duckdb::LogicalType,_true> arguments;
  ErrorData error;
  optional_idx best_function;
  vector<duckdb::LogicalType,_true> types;
  AggregateFunction bound_function;
  OrderByNullType null_order;
  FunctionBinder function_binder;
  AggregateBinder aggregate_binder;
  type local_700;
  FunctionBinder local_6f0;
  _Head_base<0UL,_duckdb::BoundOrderModifier_*,_false> local_6e0;
  undefined4 local_6d4;
  FunctionExpression *local_6d0;
  ulong local_6c8;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_6c0;
  undefined1 local_6b8 [64];
  BindResult *local_678;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_670;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> local_668;
  _Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_> local_660
  ;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> local_658;
  type local_650;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  local_648;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_628;
  idx_t local_610;
  undefined1 local_608 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5f0;
  _Alloc_hider local_5e0;
  size_type local_5d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5d0;
  undefined1 local_5c0 [40];
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Stack_598;
  AggregateFunctionCatalogEntry *local_588;
  optional_idx local_580;
  Value local_578;
  undefined1 local_538 [8];
  undefined1 local_530 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_518;
  _Alloc_hider local_508;
  element_type local_4f8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_4e8 [64];
  LogicalType LStack_4a8;
  FunctionStability local_490;
  FunctionNullHandling FStack_48f;
  FunctionErrors FStack_48e;
  FunctionCollationHandling FStack_48d;
  undefined8 auStack_488 [14];
  element_type *local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_410;
  ColumnBinding local_408;
  undefined1 local_3f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3e0;
  char local_3d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  char local_3b0 [16];
  undefined1 local_3a0 [16];
  _Alloc_hider local_390;
  pointer local_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_370;
  undefined1 local_368 [8];
  _Alloc_hider local_360;
  undefined1 local_350 [16];
  _Alloc_hider local_340;
  char local_330 [16];
  undefined1 local_320 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  optional_idx local_2f0;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_2e8;
  element_type *peStack_2e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  ExpressionBinder local_2c8;
  undefined1 local_260 [8];
  _Alloc_hider local_258;
  undefined1 local_248 [16];
  _Alloc_hider local_238;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  __node_base local_208;
  tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_> local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  optional_idx local_1e8;
  undefined1 local_1e0 [128];
  BaseScalarFunction local_160;
  undefined8 auStack_b0 [14];
  element_type *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  bVar52 = 0;
  this->bound_aggregate = true;
  local_678 = __return_storage_ptr__;
  local_610 = depth;
  local_588 = func;
  AggregateBinder::AggregateBinder
            ((AggregateBinder *)&local_2c8,(this->super_ExpressionBinder).binder,
             (this->super_ExpressionBinder).context);
  ErrorData::ErrorData((ErrorData *)local_608);
  expr = &aggr->filter;
  uVar22 = extraout_RAX;
  if ((aggr->filter).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
      (ParsedExpression *)0x0) {
    ExpressionBinder::BindChild(&local_2c8,expr,0,(ErrorData *)local_608);
    uVar22 = extraout_RAX_00;
  }
  local_6f0.context = (ClientContext *)&aggr->order_bys;
  local_6d4 = (undefined4)CONCAT71((int7)((ulong)uVar22 >> 8),1);
  if (((aggr->order_bys).
       super_unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>._M_t.
       super___uniq_ptr_impl<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_>.
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>._M_head_impl == (OrderModifier *)0x0)
     || (pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                   ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                 *)local_6f0.context),
        (long)(pOVar23->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pOVar23->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start != 0x10)) {
LAB_011b5b0e:
    bVar19 = false;
    local_6c8 = 0;
  }
  else {
    psVar1 = &aggr->function_name;
    iVar21 = ::std::__cxx11::string::compare((char *)psVar1);
    if (iVar21 == 0) {
      local_6c8 = 1;
      bVar19 = false;
    }
    else {
      iVar21 = ::std::__cxx11::string::compare((char *)psVar1);
      if ((iVar21 != 0) && (iVar21 = ::std::__cxx11::string::compare((char *)psVar1), iVar21 != 0))
      goto LAB_011b5b0e;
      pDVar36 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
      pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                              *)local_6f0.context);
      pvVar24 = vector<duckdb::OrderByNode,_true>::operator[](&pOVar23->orders,0);
      cVar2 = pvVar24->type;
      if (cVar2 == '\x01') {
        uVar3 = (pDVar36->options).default_order_type;
        cVar2 = uVar3;
      }
      bVar19 = cVar2 == '\x03';
      local_6c8 = 2;
    }
    local_6d4 = 0;
  }
  local_670._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&aggr->children;
  local_6d0 = aggr;
  if ((aggr->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (aggr->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar50 = 0;
    do {
      pvVar25 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)local_670._M_pi,sVar50);
      ExpressionBinder::BindChild(&local_2c8,pvVar25,0,(ErrorData *)local_608);
      if ((local_608[0] == false && (char)local_6d4 == '\0') &&
         (sVar50 == ((long)(aggr->children).
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(aggr->children).
                           super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           .
                           super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U)) {
        pCVar4 = (this->super_ExpressionBinder).context;
        pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar25);
        puVar27 = BoundExpression::GetExpression(pPVar26);
        pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(puVar27);
        iVar21 = (*(pEVar28->super_BaseExpression)._vptr_BaseExpression[0xf])(pEVar28);
        if ((char)iVar21 != '\0') {
          pEVar29 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(puVar27);
          ExpressionExecutor::EvaluateScalar((Value *)local_6b8,pCVar4,pEVar29,false);
          if (local_6b8[0] == (ExportAggregateFunction)0x65) {
            local_628.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_628.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_628.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            pvVar30 = ListValue::GetChildren((Value *)local_6b8);
            pVVar5 = (pvVar30->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            for (v = (pvVar30->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                     super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                     super__Vector_impl_data._M_start; v != pVVar5; v = v + 1) {
              NegatePercentileValue((Value *)local_538,v,bVar19);
              ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::
              emplace_back<duckdb::Value>
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_628,
                         (Value *)local_538);
              Value::~Value((Value *)local_538);
            }
            if (local_628.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_628.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
              local_538 = (undefined1  [8])((long)local_530 + 8);
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_538,"Empty list in percentile not allowed","");
              BinderException::BinderException(pBVar42,(string *)local_538);
              __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
            }
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_648,
                       (vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_628);
            aggr = local_6d0;
            Value::LIST(&local_578,(vector<duckdb::Value,_true> *)&local_648);
            _Var31._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_538,&local_578);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var31._M_head_impl,(Value *)local_538);
            Value::~Value((Value *)local_538);
            _Var48._M_head_impl =
                 (puVar27->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (puVar27->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var31._M_head_impl;
            if (_Var48._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var48._M_head_impl)->super_BaseExpression + 8))();
            }
            Value::~Value(&local_578);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_648);
            ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                      ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_628);
          }
          else {
            NegatePercentileValue(&local_578,(Value *)local_6b8,bVar19);
            _Var31._M_head_impl = (Expression *)operator_new(0x98);
            Value::Value((Value *)local_538,&local_578);
            BoundConstantExpression::BoundConstantExpression
                      ((BoundConstantExpression *)_Var31._M_head_impl,(Value *)local_538);
            Value::~Value((Value *)local_538);
            _Var48._M_head_impl =
                 (puVar27->
                 super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
                 _M_t.
                 super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                 .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
            (puVar27->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
            )._M_t.
            super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t
            .super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
            super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var31._M_head_impl;
            if (_Var48._M_head_impl != (Expression *)0x0) {
              (**(code **)(*(long *)&(_Var48._M_head_impl)->super_BaseExpression + 8))();
            }
            Value::~Value(&local_578);
          }
          Value::~Value((Value *)local_6b8);
        }
      }
      sVar50 = sVar50 + 1;
    } while (sVar50 < (ulong)((long)(aggr->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(aggr->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if (((((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_> *)
        &((local_6f0.context)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
         internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super__Head_base<0UL,_duckdb::OrderModifier_*,_false>)._M_head_impl != (OrderModifier *)0x0)
     && (pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                   ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                 *)local_6f0.context),
        (pOVar23->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pOVar23->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
    pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)local_6f0.context);
    pOVar45 = (pOVar23->orders).
              super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
              super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
              super__Vector_impl_data._M_start;
    pOVar6 = (pOVar23->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pOVar45 != pOVar6) {
      do {
        this_00 = &pOVar45->expression;
        pPVar32 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator->(this_00);
        if ((pPVar32->super_BaseExpression).type == VALUE_CONSTANT) {
          this_01 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                     ::operator->(this_00)->super_BaseExpression;
          pCVar33 = BaseExpression::Cast<duckdb::ConstantExpression>(this_01);
          bVar19 = LogicalType::IsIntegral(&(pCVar33->value).type_);
          if ((!bVar19) &&
             (pCVar34 = ClientConfig::GetConfig((this->super_ExpressionBinder).context),
             pCVar34->order_by_non_integer_literal == false)) {
            pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
            pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      ::operator*(this_00);
            local_538 = (undefined1  [8])((long)local_530 + 8);
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_538,
                       "ORDER BY non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to allow this behavior.\n\nPerhaps you misplaced ORDER BY; ORDER BY must appear after all regular arguments of the aggregate."
                       ,"");
            BinderException::BinderException<>(pBVar42,pPVar26,(string *)local_538);
            __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        ExpressionBinder::BindChild(&local_2c8,this_00,0,(ErrorData *)local_608);
        pOVar45 = pOVar45 + 1;
      } while (pOVar45 != pOVar6);
    }
  }
  pFVar18 = local_6d0;
  if (local_608[0] == true) {
    if (local_2c8.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_2c8.bound_columns.
        super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        .
        super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1e0._0_2_ = local_608._0_2_;
      if ((undefined1 *)local_608._8_8_ == local_608 + 0x18) {
        local_1e0._32_4_ = local_5f0._8_4_;
        local_1e0._36_4_ = local_5f0._12_4_;
        local_1e0._8_8_ = (Expression *)(local_1e0 + 0x18);
      }
      else {
        local_1e0._8_8_ = local_608._8_8_;
      }
      local_1e0._16_8_ = local_608._16_8_;
      local_608._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_5f0._M_allocated_capacity._0_4_ = local_5f0._M_allocated_capacity._0_4_ & 0xffffff00;
      if (local_5e0._M_p == local_608 + 0x38) {
        local_1e0._64_4_ = local_5d0._8_4_;
        local_1e0._68_4_ = local_5d0._12_4_;
        local_1e0._40_8_ = local_1e0 + 0x38;
      }
      else {
        local_1e0._40_8_ = local_5e0._M_p;
      }
      local_1e0._48_8_ = local_5d8;
      local_5d8 = 0;
      local_5d0._M_allocated_capacity._0_4_ = local_5d0._M_allocated_capacity._0_4_ & 0xffffff00;
      local_608._8_8_ = local_608 + 0x18;
      local_5e0._M_p = local_608 + 0x38;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_1e0 + 0x48),local_5c0);
      BindResult::BindResult(local_678,(ErrorData *)local_1e0);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)(local_1e0 + 0x48));
      if ((undefined1 *)local_1e0._40_8_ != local_1e0 + 0x38) {
        operator_delete((void *)local_1e0._40_8_);
      }
      _Var48._M_head_impl = (Expression *)local_1e0._8_8_;
      if ((Expression *)local_1e0._8_8_ == (Expression *)(local_1e0 + 0x18)) goto LAB_011b6f6d;
LAB_011b6f68:
      operator_delete(_Var48._M_head_impl);
      goto LAB_011b6f6d;
    }
    if ((local_6d0->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (local_6d0->children).
        super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      sVar50 = 0;
      do {
        pvVar25 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)local_670._M_pi,sVar50);
        local_3f8._16_2_ = local_608._0_2_;
        local_3e0._M_allocated_capacity = (size_type)local_3d0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3e0,local_608._8_8_,
                   (pointer)((long)(_func_int ***)local_608._16_8_ + local_608._8_8_));
        local_3c0._M_allocated_capacity = (size_type)local_3b0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_3c0,local_5e0._M_p,local_5e0._M_p + local_5d8);
        local_3a0._0_8_ = (pointer)0x0;
        local_3a0._8_8_ = local_5c0._8_8_;
        local_390._M_p = (pointer)0x0;
        local_388 = (pointer)local_5c0._24_8_;
        local_380._M_allocated_capacity = local_5c0._32_8_;
        local_380._8_8_ =
             _Stack_598._M_t.
             super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
             super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
        local_370._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_6b8._0_8_ = (type)local_3a0;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)local_3a0,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_5c0,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                    *)local_6b8);
        ExpressionBinder::BindCorrelatedColumns
                  ((BindResult *)local_538,&local_2c8,pvVar25,(ErrorData *)(local_3f8 + 0x10));
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_3a0);
        if ((char *)local_3c0._M_allocated_capacity != local_3b0) {
          operator_delete((void *)local_3c0._M_allocated_capacity);
        }
        if ((char *)local_3e0._M_allocated_capacity != local_3d0) {
          operator_delete((void *)local_3e0._M_allocated_capacity);
        }
        if (local_530[0] == true) {
          local_6b8._0_8_ = local_6b8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_6b8,anon_var_dwarf_63b5960 + 9);
          ErrorData::Throw((ErrorData *)local_530,(string *)local_6b8);
        }
        pvVar25 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                  ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                                *)local_670._M_pi,sVar50);
        pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  ::operator*(pvVar25);
        puVar27 = BoundExpression::GetExpression(pPVar26);
        pBVar7 = (this->super_ExpressionBinder).binder;
        pEVar29 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator*(puVar27);
        ExpressionBinder::ExtractCorrelatedExpressions(pBVar7,pEVar29);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(local_4e8);
        if ((element_type *)local_508._M_p != &local_4f8) {
          operator_delete(local_508._M_p);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_530._8_8_ != &local_518) {
          operator_delete((void *)local_530._8_8_);
        }
        if (local_538 != (undefined1  [8])0x0) {
          (*((BaseExpression *)local_538)->_vptr_BaseExpression[1])();
        }
        sVar50 = sVar50 + 1;
      } while (sVar50 < (ulong)((long)(pFVar18->children).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(pFVar18->children).
                                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      .
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    if ((expr->
        super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
        _M_t.
        super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
        .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl !=
        (ParsedExpression *)0x0) {
      local_260._0_2_ = local_608._0_2_;
      local_258._M_p = local_248;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,local_608._8_8_,
                 (pointer)((long)(_func_int ***)local_608._16_8_ + local_608._8_8_));
      local_238._M_p = local_228;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_5e0._M_p,local_5e0._M_p + local_5d8);
      local_218._0_8_ = (pointer)0x0;
      local_218._8_8_ = local_5c0._8_8_;
      local_208._M_nxt = (_Hash_node_base *)0x0;
      local_200.
      super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
      super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
           local_5c0._24_8_;
      local_1f8._M_allocated_capacity = local_5c0._32_8_;
      local_1f8._8_8_ =
           _Stack_598._M_t.
           super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
           super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
      local_1e8.index = 0;
      local_6b8._0_8_ = (type)local_218;
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::
      _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)local_218,
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)local_5c0,
                 (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                  *)local_6b8);
      ExpressionBinder::BindCorrelatedColumns
                ((BindResult *)local_538,&local_2c8,expr,(ErrorData *)local_260);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)local_218);
      if (local_238._M_p != local_228) {
        operator_delete(local_238._M_p);
      }
      if (local_258._M_p != local_248) {
        operator_delete(local_258._M_p);
      }
      if (local_530[0] == true) {
        local_6b8._0_8_ = local_6b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6b8,anon_var_dwarf_63b5960 + 9);
        ErrorData::Throw((ErrorData *)local_530,(string *)local_6b8);
      }
      pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(expr);
      puVar27 = BoundExpression::GetExpression(pPVar26);
      pBVar7 = (this->super_ExpressionBinder).binder;
      pEVar29 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator*(puVar27);
      ExpressionBinder::ExtractCorrelatedExpressions(pBVar7,pEVar29);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_4e8);
      if ((element_type *)local_508._M_p != &local_4f8) {
        operator_delete(local_508._M_p);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_530._8_8_ != &local_518) {
        operator_delete((void *)local_530._8_8_);
      }
      if (local_538 != (undefined1  [8])0x0) {
        (*((BaseExpression *)local_538)->_vptr_BaseExpression[1])();
      }
    }
    if (((((_Tuple_impl<0UL,_duckdb::OrderModifier_*,_std::default_delete<duckdb::OrderModifier>_> *
           )&((local_6f0.context)->super_enable_shared_from_this<duckdb::ClientContext>).
             __weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         super__Head_base<0UL,_duckdb::OrderModifier_*,_false>)._M_head_impl != (OrderModifier *)0x0
        ) && (pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                                      *)local_6f0.context),
             (pOVar23->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pOVar23->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish)) {
      pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                              *)local_6f0.context);
      pOVar45 = (pOVar23->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar6 = (pOVar23->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pOVar45 != pOVar6) {
        do {
          local_368._0_2_ = local_608._0_2_;
          local_360._M_p = local_350;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_360,local_608._8_8_,
                     (pointer)((long)(_func_int ***)local_608._16_8_ + local_608._8_8_));
          local_340._M_p = local_330;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_340,local_5e0._M_p,local_5e0._M_p + local_5d8);
          local_320._0_8_ = (pointer)0x0;
          local_320._8_8_ = local_5c0._8_8_;
          local_310._M_allocated_capacity = 0;
          local_310._8_8_ = local_5c0._24_8_;
          local_300._M_allocated_capacity = local_5c0._32_8_;
          local_300._8_8_ =
               _Stack_598._M_t.
               super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
               .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
          local_2f0.index = 0;
          local_6b8._0_8_ = (type)local_320;
          ::std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::
          _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)local_320,
                     (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_5c0,
                     (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
                      *)local_6b8);
          ExpressionBinder::BindCorrelatedColumns
                    ((BindResult *)local_538,&local_2c8,&pOVar45->expression,(ErrorData *)local_368)
          ;
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)local_320);
          if (local_340._M_p != local_330) {
            operator_delete(local_340._M_p);
          }
          if ((element_type *)local_360._M_p != (element_type *)local_350) {
            operator_delete(local_360._M_p);
          }
          if (local_530[0] == true) {
            local_6b8._0_8_ = local_6b8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_6b8,anon_var_dwarf_63b5960 + 9);
            ErrorData::Throw((ErrorData *)local_530,(string *)local_6b8);
          }
          pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pOVar45->expression);
          puVar27 = BoundExpression::GetExpression(pPVar26);
          pBVar7 = (this->super_ExpressionBinder).binder;
          pEVar29 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*(puVar27);
          ExpressionBinder::ExtractCorrelatedExpressions(pBVar7,pEVar29);
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(local_4e8);
          if ((element_type *)local_508._M_p != &local_4f8) {
            operator_delete(local_508._M_p);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_530._8_8_ != &local_518) {
            operator_delete((void *)local_530._8_8_);
          }
          if (local_538 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_538)->_vptr_BaseExpression[1])();
          }
          pOVar45 = pOVar45 + 1;
        } while (pOVar45 != pOVar6);
      }
    }
  }
  else if ((local_610 != 0) &&
          (local_2c8.bound_columns.
           super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           .
           super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           ._M_impl.super__Vector_impl_data._M_start ==
           local_2c8.bound_columns.
           super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           .
           super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
    local_538 = (undefined1  [8])((long)local_530 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_538,
               "Aggregate with only constant parameters has to be bound in the root subquery","");
    BindResult::BindResult(local_678,(string *)local_538);
    _Var48._M_head_impl = (Expression *)local_538;
    if (local_538 == (undefined1  [8])((long)local_530 + 8)) goto LAB_011b6f6d;
    goto LAB_011b6f68;
  }
  if ((expr->
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl ==
      (ParsedExpression *)0x0) {
    local_700 = (type)0x0;
  }
  else {
    pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator*(expr);
    puVar27 = BoundExpression::GetExpression(pPVar26);
    pCVar4 = (this->super_ExpressionBinder).context;
    local_6c0._M_head_impl =
         (puVar27->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>).
         _M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
         .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (puVar27->super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)0x0;
    LogicalType::LogicalType((LogicalType *)local_538,BOOLEAN);
    BoundCastExpression::AddCastToType
              ((BoundCastExpression *)local_6b8,pCVar4,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_6c0,(LogicalType *)local_538,false);
    local_700 = (type)local_6b8._0_8_;
    local_6b8._0_8_ = (type)0x0;
    LogicalType::~LogicalType((LogicalType *)local_538);
    if (local_6c0._M_head_impl != (Expression *)0x0) {
      (*((local_6c0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_6c0._M_head_impl = (Expression *)0x0;
  }
  pFVar18 = local_6d0;
  local_578.type_.id_ = INVALID;
  local_578.type_.physical_type_ = ~INVALID;
  local_578.type_._2_6_ = 0;
  local_578.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_578.type_.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_628.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_628.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_628.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_648.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((char)local_6d4 == '\0') {
    iVar21 = ::std::__cxx11::string::compare((char *)&local_6d0->function_name);
    if ((ulong)((long)(pFVar18->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pFVar18->children).
                      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      .
                      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) < local_6c8) {
      pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                              *)local_6f0.context);
      pOVar45 = (pOVar23->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar6 = (pOVar23->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      if (pOVar45 != pOVar6) {
        do {
          pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    ::operator*(&pOVar45->expression);
          puVar27 = BoundExpression::GetExpression(pPVar26);
          pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar27);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_578
                     ,&pEVar28->return_type);
          pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->(puVar27);
          ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                    (&local_628,&pEVar28->return_type);
          if (iVar21 == 0) {
            pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->(puVar27);
            (*(pEVar28->super_BaseExpression)._vptr_BaseExpression[0x11])
                      ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_538,pEVar28);
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_648,
                       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)local_538);
            if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
                local_538 != (Expression *)0x0) {
              (**(code **)(*(undefined **)local_538 + 8))();
            }
          }
          else {
            ::std::
            vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
            ::
            emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                      ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                        *)&local_648,puVar27);
          }
          pOVar45 = pOVar45 + 1;
        } while (pOVar45 != pOVar6);
      }
    }
    if (iVar21 != 0) {
      pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                              *)local_6f0.context);
      pOVar45 = (pOVar23->orders).
                super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pOVar6 = (pOVar23->orders).
               super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
               super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl
               .super__Vector_impl_data._M_finish;
      pOVar49 = pOVar45;
      if (pOVar6 != pOVar45) {
        do {
          _Var8._M_head_impl =
               (pOVar49->expression).
               super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
               .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
          if (_Var8._M_head_impl != (ParsedExpression *)0x0) {
            (**(code **)(*(long *)&(_Var8._M_head_impl)->super_BaseExpression + 8))();
          }
          (pOVar49->expression).
          super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
          .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
               (ParsedExpression *)0x0;
          pOVar49 = pOVar49 + 1;
        } while (pOVar49 != pOVar6);
        (pOVar23->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
        super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
        super__Vector_impl_data._M_finish = pOVar45;
      }
    }
  }
  pFVar18 = local_6d0;
  if ((local_6d0->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (local_6d0->children).
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    sVar50 = 0;
    do {
      pvVar25 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                ::operator[]((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                              *)local_670._M_pi,sVar50);
      pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(pvVar25);
      puVar27 = BoundExpression::GetExpression(pPVar26);
      pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar27);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_578,
                 &pEVar28->return_type);
      pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar27);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                (&local_628,&pEVar28->return_type);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&local_648,puVar27);
      sVar50 = sVar50 + 1;
    } while (sVar50 < (ulong)((long)(pFVar18->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pFVar18->children).
                                    super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    .
                                    super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  FunctionBinder::FunctionBinder((FunctionBinder *)local_3f8,(this->super_ExpressionBinder).binder);
  this_03 = &local_588->functions;
  local_580 = FunctionBinder::BindFunction
                        ((FunctionBinder *)local_3f8,
                         &(local_588->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
                          super_CatalogEntry.name,this_03,
                         (vector<duckdb::LogicalType,_true> *)&local_578,(ErrorData *)local_608);
  if (local_580.index == 0xffffffffffffffff) {
    ErrorData::AddQueryLocation((ErrorData *)local_608,&pFVar18->super_ParsedExpression);
    local_538 = (undefined1  [8])((long)local_530 + 8);
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_538,anon_var_dwarf_63b5960 + 9);
    ErrorData::Throw((ErrorData *)local_608,(string *)local_538);
  }
  offset = optional_idx::GetIndex(&local_580);
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            ((AggregateFunction *)local_538,&this_03->super_FunctionSet<duckdb::AggregateFunction>,
             offset);
  local_6e0._M_head_impl = (BoundOrderModifier *)0x0;
  pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
            operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                        *)local_6f0.context);
  if ((pOVar23->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pOVar23->orders).super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
      super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    _Var35._M_head_impl = (BoundOrderModifier *)operator_new(0x28);
    BoundOrderModifier::BoundOrderModifier(_Var35._M_head_impl);
    if (local_6e0._M_head_impl != (BoundOrderModifier *)0x0) {
      pBVar15 = &(local_6e0._M_head_impl)->super_BoundResultModifier;
      local_6e0._M_head_impl = _Var35._M_head_impl;
      (*pBVar15->_vptr_BoundResultModifier[1])();
      _Var35._M_head_impl = local_6e0._M_head_impl;
    }
    local_6e0._M_head_impl = _Var35._M_head_impl;
    pDVar36 = DBConfig::GetConfig((this->super_ExpressionBinder).context);
    pOVar23 = unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>::
              operator->((unique_ptr<duckdb::OrderModifier,_std::default_delete<duckdb::OrderModifier>,_true>
                          *)local_6f0.context);
    pOVar6 = (pOVar23->orders).
             super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
             super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pOVar45 = (pOVar23->orders).
                   super_vector<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   super__Vector_base<duckdb::OrderByNode,_std::allocator<duckdb::OrderByNode>_>.
                   _M_impl.super__Vector_impl_data._M_start; pOVar45 != pOVar6;
        pOVar45 = pOVar45 + 1) {
      pPVar26 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                ::operator*(&pOVar45->expression);
      puVar27 = BoundExpression::GetExpression(pPVar26);
      pCVar4 = (this->super_ExpressionBinder).context;
      pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar27);
      this_02 = CollationBinding::Get(pCVar4);
      CollationBinding::PushCollation(this_02,pCVar4,puVar27,&pEVar28->return_type,ALL_COLLATIONS);
      order_type = DBConfig::ResolveOrder(pDVar36,pOVar45->type);
      local_6b8[0] = (ExportAggregateFunction)order_type;
      OVar20 = DBConfig::ResolveNullOrder(pDVar36,order_type,pOVar45->null_order);
      local_408.table_index = CONCAT71(local_408.table_index._1_7_,OVar20);
      pBVar37 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                              *)&local_6e0);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar37->orders,local_6b8,(OrderByNullType *)&local_408,puVar27);
    }
  }
  if ((local_6d0->distinct == true) && (local_6e0._M_head_impl != (BoundOrderModifier *)0x0)) {
    pBVar37 = unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
              ::operator->((unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>,_true>
                            *)&local_6e0);
    pBVar51 = (pBVar37->orders).
              super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
              super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar9 = (pBVar37->orders).
             super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>.
             super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pBVar51 != pBVar9) {
      bVar44 = 1;
      do {
        bVar19 = IsFunctionallyDependent(&pBVar51->expression,&local_648);
        bVar44 = bVar44 & bVar19;
        pBVar51 = pBVar51 + 1;
      } while (pBVar51 != pBVar9);
      if (bVar44 == 0) {
        pBVar42 = (BinderException *)__cxa_allocate_exception(0x10);
        local_6b8._0_8_ = local_6b8 + 0x10;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_6b8,
                   "In a DISTINCT aggregate, ORDER BY expressions must appear in the argument list",
                   "");
        BinderException::BinderException(pBVar42,(string *)local_6b8);
        __cxa_throw(pBVar42,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
  }
  SimpleFunction::SimpleFunction(&local_160.super_SimpleFunction,(SimpleFunction *)local_538);
  local_160.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::LogicalType(&local_160.return_type,&LStack_4a8);
  pFVar18 = local_6d0;
  local_160.stability = local_490;
  local_160.null_handling = FStack_48f;
  local_160.errors = FStack_48e;
  local_160.collation_handling = FStack_48d;
  local_160.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  puVar46 = auStack_488;
  puVar47 = auStack_b0;
  for (lVar43 = 0xd; lVar43 != 0; lVar43 = lVar43 + -1) {
    *puVar47 = *puVar46;
    puVar46 = puVar46 + (ulong)bVar52 * -2 + 1;
    puVar47 = puVar47 + (ulong)bVar52 * -2 + 1;
  }
  auStack_b0[0xd]._0_1_ = (AggregateOrderDependent)auStack_488[0xd];
  auStack_b0[0xd]._1_1_ = auStack_488[0xd]._1_1_;
  local_40 = local_418;
  local_38 = local_410._M_pi;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_410._M_pi)->_M_use_count = (local_410._M_pi)->_M_use_count + 1;
    }
  }
  local_2e8._M_head_impl =
       (Expression *)
       local_648.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  peStack_2e0 = (element_type *)
                local_648.
                super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_2d8._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       local_648.
       super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       .
       super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_648.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.
  super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_650 = local_700;
  FunctionBinder::BindAggregateFunction
            (&local_6f0,(AggregateFunction *)local_3f8,
             (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              *)&local_160,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_2e8,(AggregateType)&local_650);
  if (local_650 != (type)0x0) {
    (*(local_650->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
  }
  local_650 = (type)0x0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_2e8);
  local_160.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__AggregateFunction_02477a08;
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_160);
  if (pFVar18->export_state == true) {
    local_658._M_head_impl = (BoundAggregateExpression *)local_6f0.binder.ptr;
    local_6f0.binder.ptr = (Binder *)0x0;
    ExportAggregateFunction::Bind
              ((ExportAggregateFunction *)local_6b8,
               (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                *)&local_658);
    uVar22 = local_6b8._0_8_;
    oVar16.ptr = local_6f0.binder.ptr;
    local_6b8._0_8_ = (Expression *)0x0;
    local_6f0.binder.ptr = (Binder *)uVar22;
    if (oVar16.ptr != (Binder *)0x0) {
      (*(code *)((((oVar16.ptr)->super_enable_shared_from_this<duckdb::Binder>).__weak_this_.
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    if ((Expression *)local_6b8._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_6b8._0_8_)->_vptr_BaseExpression[1])();
    }
    local_6b8._0_8_ = (type)0x0;
    if ((Binder *)local_658._M_head_impl != (Binder *)0x0) {
      (*((local_658._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    local_658._M_head_impl = (BoundAggregateExpression *)0x0;
  }
  pBVar38 = unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                          *)&local_6f0);
  _Var17._M_head_impl = local_6e0._M_head_impl;
  local_6e0._M_head_impl = (BoundOrderModifier *)0x0;
  _Var35._M_head_impl =
       (pBVar38->order_bys).
       super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
       .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl;
  (pBVar38->order_bys).
  super_unique_ptr<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::BoundOrderModifier,_std::default_delete<duckdb::BoundOrderModifier>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundOrderModifier_*,_std::default_delete<duckdb::BoundOrderModifier>_>
  .super__Head_base<0UL,_duckdb::BoundOrderModifier_*,_false>._M_head_impl = _Var17._M_head_impl;
  if (_Var35._M_head_impl != (BoundOrderModifier *)0x0) {
    (**(code **)(*(long *)&(_Var35._M_head_impl)->super_BoundResultModifier + 8))();
  }
  pBVar10 = this->node;
  local_6b8._0_8_ =
       unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
       ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                    *)&local_6f0);
  iVar39 = ::std::
           _Hashtable<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(pBVar10->aggregate_map)._M_h,(key_type *)local_6b8);
  if (iVar39.
      super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    pBVar10 = this->node;
    puVar11 = (pBVar10->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    puVar12 = (pBVar10->aggregates).
              super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_6b8._0_8_ =
         unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
         ::operator*((unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
                      *)&local_6f0);
    pmVar40 = ::std::__detail::
              _Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::reference_wrapper<duckdb::Expression>,_std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::ExpressionEquality<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pBVar10->aggregate_map,(key_type *)local_6b8);
    local_6b8._0_8_ = local_6f0.binder.ptr;
    __n = (long)puVar11 - (long)puVar12 >> 3;
    *pmVar40 = __n;
    local_6f0.binder.ptr = (Binder *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&this->node->aggregates,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               local_6b8);
    if ((type)local_6b8._0_8_ != (type)0x0) {
      (*(((Expression *)local_6b8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  else {
    __n = *(size_type *)
           ((long)iVar39.
                  super__Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Expression>,_unsigned_long>,_true>
                  ._M_cur + 0x10);
  }
  sVar13 = (pFVar18->super_ParsedExpression).super_BaseExpression.alias._M_string_length;
  if (sVar13 == 0) {
    pvVar41 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
              ::operator[](&this->node->aggregates,__n);
    pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(pvVar41);
    (*(pEVar28->super_BaseExpression)._vptr_BaseExpression[8])(local_6b8,pEVar28);
  }
  else {
    local_6b8._0_8_ = local_6b8 + 0x10;
    pcVar14 = (pFVar18->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_6b8,pcVar14,pcVar14 + sVar13);
  }
  pvVar41 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&this->node->aggregates,__n);
  pEVar28 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(pvVar41);
  local_408.table_index = this->node->aggregate_index;
  local_408.column_index = __n;
  make_uniq<duckdb::BoundColumnRefExpression,std::__cxx11::string_const,duckdb::LogicalType&,duckdb::ColumnBinding,unsigned_long&>
            ((duckdb *)&local_660,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6b8,
             &pEVar28->return_type,&local_408,&local_610);
  if ((type)local_6b8._0_8_ != (type)(local_6b8 + 0x10)) {
    operator_delete((void *)local_6b8._0_8_);
  }
  local_668 = local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::BaseStatistics_*,_false>)(BaseStatistics *)0x0;
  BindResult::BindResult
            (local_678,
             (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             &local_668);
  if ((_Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>)
      local_668._M_head_impl != (BaseStatistics *)0x0) {
    (**(code **)(*(long *)&(local_668._M_head_impl)->type + 8))();
  }
  local_668._M_head_impl = (BaseStatistics *)0x0;
  if (local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl !=
      (BaseStatistics *)0x0) {
    (**(code **)(*(long *)local_660.super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>.
                          _M_head_impl + 8))();
  }
  if (local_6f0.binder.ptr != (Binder *)0x0) {
    (*(((Expression *)&(local_6f0.binder.ptr)->super_enable_shared_from_this<duckdb::Binder>)->
      super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (local_6e0._M_head_impl != (BoundOrderModifier *)0x0) {
    (*((local_6e0._M_head_impl)->super_BoundResultModifier)._vptr_BoundResultModifier[1])();
  }
  local_538 = (undefined1  [8])&PTR__AggregateFunction_02477a08;
  if (local_410._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_410._M_pi);
  }
  BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_538);
  ::std::
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             *)&local_648);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_628);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_578);
LAB_011b6f6d:
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_5c0);
  if (local_5e0._M_p != local_608 + 0x38) {
    operator_delete(local_5e0._M_p);
  }
  if ((undefined1 *)local_608._8_8_ != local_608 + 0x18) {
    operator_delete((void *)local_608._8_8_);
  }
  ExpressionBinder::~ExpressionBinder(&local_2c8);
  return local_678;
}

Assistant:

BindResult BaseSelectBinder::BindAggregate(FunctionExpression &aggr, AggregateFunctionCatalogEntry &func, idx_t depth) {
	// first bind the child of the aggregate expression (if any)
	this->bound_aggregate = true;
	unique_ptr<Expression> bound_filter;
	AggregateBinder aggregate_binder(binder, context);
	ErrorData error;

	// Now we bind the filter (if any)
	if (aggr.filter) {
		aggregate_binder.BindChild(aggr.filter, 0, error);
	}

	// Handle ordered-set aggregates by moving the single ORDER BY expression to the front of the children.
	//	https://www.postgresql.org/docs/current/functions-aggregate.html#FUNCTIONS-ORDEREDSET-TABLE
	// We also have to handle ORDER BY in the argument list, so note how many arguments we should have
	// and only inject the ordering expression if there are too few.
	idx_t ordered_set_agg = 0;
	bool negate_fractions = false;
	if (aggr.order_bys && aggr.order_bys->orders.size() == 1) {
		const auto &func_name = aggr.function_name;
		if (func_name == "mode") {
			ordered_set_agg = 1;
		} else if (func_name == "quantile_cont" || func_name == "quantile_disc") {
			ordered_set_agg = 2;

			auto &config = DBConfig::GetConfig(context);
			const auto &order = aggr.order_bys->orders[0];
			const auto sense =
			    (order.type == OrderType::ORDER_DEFAULT) ? config.options.default_order_type : order.type;
			negate_fractions = (sense == OrderType::DESCENDING);
		}
	}

	for (idx_t i = 0; i < aggr.children.size(); ++i) {
		auto &child = aggr.children[i];
		aggregate_binder.BindChild(child, 0, error);
		// We have to negate the fractions for PERCENTILE_XXXX DESC
		if (!error.HasError() && ordered_set_agg && i == aggr.children.size() - 1) {
			NegatePercentileFractions(context, child, negate_fractions);
		}
	}

	// Bind the ORDER BYs, if any
	if (aggr.order_bys && !aggr.order_bys->orders.empty()) {
		for (auto &order : aggr.order_bys->orders) {
			if (order.expression->GetExpressionType() == ExpressionType::VALUE_CONSTANT) {
				auto &const_expr = order.expression->Cast<ConstantExpression>();
				if (!const_expr.value.type().IsIntegral()) {
					auto &config = ClientConfig::GetConfig(context);
					if (!config.order_by_non_integer_literal) {
						throw BinderException(
						    *order.expression,
						    "ORDER BY non-integer literal has no effect.\n* SET order_by_non_integer_literal=true to "
						    "allow this behavior.\n\nPerhaps you misplaced ORDER BY; ORDER BY must appear "
						    "after all regular arguments of the aggregate.");
					}
				}
			}
			aggregate_binder.BindChild(order.expression, 0, error);
		}
	}

	if (error.HasError()) {
		// failed to bind child
		if (aggregate_binder.HasBoundColumns()) {
			for (idx_t i = 0; i < aggr.children.size(); i++) {
				// however, we bound columns!
				// that means this aggregation belongs to this node
				// check if we have to resolve any errors by binding with parent binders
				auto result = aggregate_binder.BindCorrelatedColumns(aggr.children[i], error);
				// if there is still an error after this, we could not successfully bind the aggregate
				if (result.HasError()) {
					result.error.Throw();
				}
				auto &bound_expr = BoundExpression::GetExpression(*aggr.children[i]);
				ExtractCorrelatedExpressions(binder, *bound_expr);
			}
			if (aggr.filter) {
				auto result = aggregate_binder.BindCorrelatedColumns(aggr.filter, error);
				// if there is still an error after this, we could not successfully bind the aggregate
				if (result.HasError()) {
					result.error.Throw();
				}
				auto &bound_expr = BoundExpression::GetExpression(*aggr.filter);
				ExtractCorrelatedExpressions(binder, *bound_expr);
			}
			if (aggr.order_bys && !aggr.order_bys->orders.empty()) {
				for (auto &order : aggr.order_bys->orders) {
					auto result = aggregate_binder.BindCorrelatedColumns(order.expression, error);
					if (result.HasError()) {
						result.error.Throw();
					}
					auto &bound_expr = BoundExpression::GetExpression(*order.expression);
					ExtractCorrelatedExpressions(binder, *bound_expr);
				}
			}
		} else {
			// we didn't bind columns, try again in children
			return BindResult(std::move(error));
		}
	} else if (depth > 0 && !aggregate_binder.HasBoundColumns()) {
		return BindResult("Aggregate with only constant parameters has to be bound in the root subquery");
	}

	if (aggr.filter) {
		auto &child = BoundExpression::GetExpression(*aggr.filter);
		bound_filter = BoundCastExpression::AddCastToType(context, std::move(child), LogicalType::BOOLEAN);
	}

	// all children bound successfully
	// extract the children and types
	vector<LogicalType> types;
	vector<LogicalType> arguments;
	vector<unique_ptr<Expression>> children;

	if (ordered_set_agg) {
		const bool order_sensitive = (aggr.function_name == "mode");
		// Inject missing ordering arguments
		if (aggr.children.size() < ordered_set_agg) {
			for (auto &order : aggr.order_bys->orders) {
				auto &child = BoundExpression::GetExpression(*order.expression);
				types.push_back(child->return_type);
				arguments.push_back(child->return_type);
				if (order_sensitive) {
					children.push_back(child->Copy());
				} else {
					children.push_back(std::move(child));
				}
			}
		}
		if (!order_sensitive) {
			aggr.order_bys->orders.clear();
		}
	}

	for (idx_t i = 0; i < aggr.children.size(); i++) {
		auto &child = BoundExpression::GetExpression(*aggr.children[i]);
		types.push_back(child->return_type);
		arguments.push_back(child->return_type);
		children.push_back(std::move(child));
	}

	// bind the aggregate
	FunctionBinder function_binder(binder);
	auto best_function = function_binder.BindFunction(func.name, func.functions, types, error);
	if (!best_function.IsValid()) {
		error.AddQueryLocation(aggr);
		error.Throw();
	}
	// found a matching function!
	auto bound_function = func.functions.GetFunctionByOffset(best_function.GetIndex());

	// Bind any sort columns, unless the aggregate is order-insensitive
	unique_ptr<BoundOrderModifier> order_bys;
	if (!aggr.order_bys->orders.empty()) {
		order_bys = make_uniq<BoundOrderModifier>();
		auto &config = DBConfig::GetConfig(context);
		for (auto &order : aggr.order_bys->orders) {
			auto &order_expr = BoundExpression::GetExpression(*order.expression);
			PushCollation(context, order_expr, order_expr->return_type);
			const auto sense = config.ResolveOrder(order.type);
			const auto null_order = config.ResolveNullOrder(sense, order.null_order);
			order_bys->orders.emplace_back(sense, null_order, std::move(order_expr));
		}
	}

	// If the aggregate is DISTINCT then the ORDER BYs need to be functional dependencies of the arguments.
	if (aggr.distinct && order_bys) {
		bool in_args = true;
		for (const auto &order_by : order_bys->orders) {
			in_args &= IsFunctionallyDependent(order_by.expression, children);
		}

		if (!in_args) {
			throw BinderException("In a DISTINCT aggregate, ORDER BY expressions must appear in the argument list");
		}
	}

	auto aggregate =
	    function_binder.BindAggregateFunction(bound_function, std::move(children), std::move(bound_filter),
	                                          aggr.distinct ? AggregateType::DISTINCT : AggregateType::NON_DISTINCT);
	if (aggr.export_state) {
		aggregate = ExportAggregateFunction::Bind(std::move(aggregate));
	}
	aggregate->order_bys = std::move(order_bys);

	// check for all the aggregates if this aggregate already exists
	idx_t aggr_index;
	auto entry = node.aggregate_map.find(*aggregate);
	if (entry == node.aggregate_map.end()) {
		// new aggregate: insert into aggregate list
		aggr_index = node.aggregates.size();
		node.aggregate_map[*aggregate] = aggr_index;
		node.aggregates.push_back(std::move(aggregate));
	} else {
		// duplicate aggregate: simplify refer to this aggregate
		aggr_index = entry->second;
	}

	// now create a column reference referring to the aggregate
	auto colref = make_uniq<BoundColumnRefExpression>(
	    aggr.GetAlias().empty() ? node.aggregates[aggr_index]->ToString() : aggr.GetAlias(),
	    node.aggregates[aggr_index]->return_type, ColumnBinding(node.aggregate_index, aggr_index), depth);
	// move the aggregate expression into the set of bound aggregates
	return BindResult(std::move(colref));
}